

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O0

int Nwk_ManVerifyLevel(Nwk_Man_t *pNtk)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Nwk_Obj_t *pObj_00;
  uint local_20;
  int i;
  int LevelNew;
  Nwk_Obj_t *pObj;
  Nwk_Man_t *pNtk_local;
  
  local_20 = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= (int)local_20) {
      return 1;
    }
    pObj_00 = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vObjs,local_20);
    if (pObj_00 != (Nwk_Obj_t *)0x0) {
      if ((*(uint *)&pObj_00->field_0x20 >> 4 & 1) != 0) {
        __assert_fail("pObj->MarkA == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                      ,0x346,"int Nwk_ManVerifyLevel(Nwk_Man_t *)");
      }
      uVar2 = Nwk_ObjLevelNew(pObj_00);
      uVar3 = Nwk_ObjLevel(pObj_00);
      if (uVar3 != uVar2) {
        uVar3 = Nwk_ObjLevel(pObj_00);
        printf("Object %6d: Mismatch betweeh levels: Actual = %d. Correct = %d.\n",(ulong)local_20,
               (ulong)uVar3,(ulong)uVar2);
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

int Nwk_ManVerifyLevel( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pObj;
    int LevelNew, i;
    Nwk_ManForEachObj( pNtk, pObj, i )
    {
        assert( pObj->MarkA == 0 );
        LevelNew = Nwk_ObjLevelNew( pObj );
        if ( Nwk_ObjLevel(pObj) != LevelNew )
        {
            printf( "Object %6d: Mismatch betweeh levels: Actual = %d. Correct = %d.\n", 
                i, Nwk_ObjLevel(pObj), LevelNew );
        }
    }
    return 1;
}